

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::avx512::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  RTCFormat RVar1;
  InstanceArray *this;
  RTCRayQueryContext *pRVar2;
  RawBufferView *pRVar3;
  char *pcVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  Accel *pAVar13;
  long lVar14;
  ulong i;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vfloat4 a0_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vfloat4 a0;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM2 [64];
  int iVar34;
  vfloat4 a0_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar54;
  float fVar55;
  vfloat4 a1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  RayQueryContext newcontext;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  auVar20 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar16 = in_ZMM2._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar13 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (((pAVar13 == (Accel *)0x0) || ((ray->mask & (this->super_Geometry).mask) == 0)) ||
     (pRVar2 = context->user, pRVar2->instID[0] != 0xffffffff)) {
    bVar12 = false;
  }
  else {
    auVar15._8_8_ = 0;
    auVar15._0_4_ = prim->primID_;
    auVar15._4_4_ = prim->instID_;
    auVar15 = vprolq_avx512vl(auVar15,0x20);
    *pRVar2 = auVar15._0_8_;
    i = (ulong)prim->primID_;
    pRVar3 = (this->l2w_buf).items;
    RVar1 = pRVar3->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar14 = pRVar3->stride * i;
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14)),
                                ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x10)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x20)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 4)),
                                ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x14)),0x1c);
        auVar20 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x24)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 8)),
                                ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x28)),0x28);
        auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x1c)),0x1c);
        auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x2c)),0x28);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar14 = pRVar3->stride * i;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(pcVar4 + lVar14 + 4);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x10);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14)),_DAT_01fbb140,auVar20);
        auVar20 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),_DAT_01fbb140,auVar17
                                    );
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)),_DAT_01fbb140,
                                          auVar19);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x28);
        auVar16 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x24)),_DAT_01fbb140,
                                     auVar18);
      }
      else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar14 = pRVar3->stride * i;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x10);
        auVar20 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(pcVar4 + lVar14 + 8)),0x20);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x34);
        auVar15 = vpermt2ps_avx512vl(auVar29,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar14)));
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x1c);
        fVar50 = *(float *)(pcVar4 + lVar14 + 0x24);
        fVar54 = *(float *)(pcVar4 + lVar14 + 0x28);
        fVar55 = *(float *)(pcVar4 + lVar14 + 0x2c);
        auVar19 = vpermt2ps_avx512vl(auVar42,_DAT_01fbb150,
                                     ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)));
        fVar56 = *(float *)(pcVar4 + lVar14 + 0x30);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar50),
                                  ZEXT416((uint)fVar50));
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
        auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar16._0_4_));
        fVar43 = auVar18._0_4_;
        fVar43 = fVar43 * 1.5 + fVar43 * fVar43 * fVar43 * auVar16._0_4_ * -0.5;
        auVar16 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar43 * fVar50)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar15,ZEXT416((uint)(fVar43 * fVar54)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar20,ZEXT416((uint)(fVar43 * fVar56)),0x30);
        auVar20 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                                ZEXT416(*(uint *)(pcVar4 + lVar14 + 4)),0x10);
        auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x3c)),0x20);
        auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar55 * fVar43)),0x30);
      }
      else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar4 = pRVar3->ptr_ofs;
        lVar14 = pRVar3->stride * i;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar14))->v;
        auVar20 = *(undefined1 (*) [16])(pcVar4 + lVar14 + 0x10);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar14 + 0x20))
                        ->v;
        auVar16 = *(undefined1 (*) [16])(pcVar4 + lVar14 + 0x30);
      }
      auVar15 = vshufps_avx(auVar16,auVar16,0xff);
      auVar18 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar17 = vshufps_avx(auVar20,auVar20,0xff);
      auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar19 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
      auVar19 = vblendps_avx(auVar19,auVar20,4);
      fVar47 = auVar18._0_4_;
      auVar29 = vfmadd213ss_fma(auVar15,auVar15,ZEXT416((uint)(fVar47 * fVar47)));
      auVar29 = vfnmadd231ss_fma(auVar29,auVar17,auVar17);
      auVar42 = vfnmadd231ss_fma(auVar29,auVar23,auVar23);
      fVar43 = auVar15._0_4_;
      auVar21 = ZEXT416((uint)(auVar23._0_4_ * fVar43));
      auVar29 = vfmadd213ss_fma(auVar17,auVar18,auVar21);
      fVar50 = auVar29._0_4_ + auVar29._0_4_;
      auVar36 = ZEXT416((uint)(auVar17._0_4_ * fVar43));
      auVar29 = vfmsub213ss_fma(auVar23,auVar18,auVar36);
      fVar54 = auVar29._0_4_ + auVar29._0_4_;
      auVar29 = vfmsub231ss_fma(auVar21,auVar18,auVar17);
      fVar55 = auVar29._0_4_ + auVar29._0_4_;
      auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar47)),auVar15,auVar15);
      auVar15 = vfmadd213ss_avx512f(auVar17,auVar17,auVar29);
      auVar21 = vfnmadd231ss_avx512f(auVar15,auVar23,auVar23);
      auVar15 = vfmadd213ss_avx512f(auVar23,auVar17,ZEXT416((uint)(fVar47 * fVar43)));
      auVar22 = vaddss_avx512f(auVar15,auVar15);
      auVar15 = vfmadd213ss_fma(auVar18,auVar23,auVar36);
      fVar56 = auVar15._0_4_ + auVar15._0_4_;
      auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar43)),auVar17,auVar23);
      fVar43 = auVar15._0_4_ + auVar15._0_4_;
      auVar15 = vfnmadd231ss_fma(auVar29,auVar17,auVar17);
      auVar18 = vfmadd231ss_fma(auVar15,auVar23,auVar23);
      uVar30 = auVar42._0_4_;
      auVar51._4_4_ = uVar30;
      auVar51._0_4_ = uVar30;
      auVar51._8_4_ = uVar30;
      auVar51._12_4_ = uVar30;
      auVar57._4_4_ = fVar50;
      auVar57._0_4_ = fVar50;
      auVar57._8_4_ = fVar50;
      auVar57._12_4_ = fVar50;
      auVar59._0_4_ = fVar54 * 0.0;
      auVar59._4_4_ = fVar54 * 0.0;
      auVar59._8_4_ = fVar54 * 1.0;
      auVar59._12_4_ = fVar54 * 0.0;
      auVar29 = ZEXT816(0x3f80000000000000);
      auVar15 = vfmadd231ps_fma(auVar59,auVar29,auVar57);
      auVar42 = SUB6416(ZEXT464(0x3f800000),0);
      auVar17 = vfmadd231ps_fma(auVar15,auVar42,auVar51);
      auVar52._4_4_ = fVar55;
      auVar52._0_4_ = fVar55;
      auVar52._8_4_ = fVar55;
      auVar52._12_4_ = fVar55;
      auVar15 = vbroadcastss_avx512vl(auVar21);
      auVar23 = vbroadcastss_avx512vl(auVar22);
      auVar58._0_4_ = auVar23._0_4_ * 0.0;
      auVar58._4_4_ = auVar23._4_4_ * 0.0;
      auVar58._8_4_ = auVar23._8_4_ * 1.0;
      auVar58._12_4_ = auVar23._12_4_ * 0.0;
      auVar15 = vfmadd231ps_fma(auVar58,auVar29,auVar15);
      auVar23 = vfmadd231ps_fma(auVar15,auVar42,auVar52);
      auVar48._4_4_ = fVar56;
      auVar48._0_4_ = fVar56;
      auVar48._8_4_ = fVar56;
      auVar48._12_4_ = fVar56;
      auVar45._4_4_ = fVar43;
      auVar45._0_4_ = fVar43;
      auVar45._8_4_ = fVar43;
      auVar45._12_4_ = fVar43;
      fVar50 = auVar18._0_4_;
      auVar53._0_4_ = fVar50 * 0.0;
      auVar53._4_4_ = fVar50 * 0.0;
      auVar53._8_4_ = fVar50 * 1.0;
      auVar53._12_4_ = fVar50 * 0.0;
      auVar15 = vfmadd231ps_fma(auVar53,auVar29,auVar45);
      auVar15 = vfmadd231ps_fma(auVar15,auVar42,auVar48);
      auVar21._0_4_ = a0.field_0._0_4_;
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = auVar21._0_4_;
      auVar21._12_4_ = auVar21._0_4_;
      fVar50 = auVar15._0_4_;
      auVar46._0_4_ = fVar50 * 0.0;
      fVar54 = auVar15._4_4_;
      auVar46._4_4_ = fVar54 * 0.0;
      fVar55 = auVar15._8_4_;
      auVar46._8_4_ = fVar55 * 0.0;
      fVar56 = auVar15._12_4_;
      auVar46._12_4_ = fVar56 * 0.0;
      auVar15 = vfmadd213ps_fma((undefined1  [16])0x0,auVar23,auVar46);
      auVar15 = vfmadd231ps_fma(auVar15,auVar17,auVar21);
      uVar30 = auVar20._0_4_;
      auVar49._4_4_ = uVar30;
      auVar49._0_4_ = uVar30;
      auVar49._8_4_ = uVar30;
      auVar49._12_4_ = uVar30;
      auVar20 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vfmadd213ps_fma(auVar20,auVar23,auVar46);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar20,auVar17,auVar49);
      iVar34 = a0_1.field_0._0_4_;
      auVar38._4_4_ = iVar34;
      auVar38._0_4_ = iVar34;
      auVar38._8_4_ = iVar34;
      auVar38._12_4_ = iVar34;
      auVar20 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar18 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar36._0_4_ = fVar50 * auVar18._0_4_;
      auVar36._4_4_ = fVar54 * auVar18._4_4_;
      auVar36._8_4_ = fVar55 * auVar18._8_4_;
      auVar36._12_4_ = fVar56 * auVar18._12_4_;
      auVar20 = vfmadd231ps_fma(auVar36,auVar23,auVar20);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar20,auVar17,auVar38);
      uVar30 = auVar16._0_4_;
      auVar39._4_4_ = uVar30;
      auVar39._0_4_ = uVar30;
      auVar39._8_4_ = uVar30;
      auVar39._12_4_ = uVar30;
      auVar20 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar22._0_4_ = fVar50 * auVar16._0_4_;
      auVar22._4_4_ = fVar54 * auVar16._4_4_;
      auVar22._8_4_ = fVar55 * auVar16._8_4_;
      auVar22._12_4_ = fVar56 * auVar16._12_4_;
      auVar16 = vfmadd231ps_fma(auVar22,auVar23,auVar20);
      auVar20 = vfmadd231ps_fma(auVar16,auVar17,auVar39);
      auVar16._0_4_ = auVar19._0_4_ + 0.0 + auVar20._0_4_;
      auVar16._4_4_ = auVar19._4_4_ + 0.0 + auVar20._4_4_;
      auVar16._8_4_ = auVar19._8_4_ + 0.0 + auVar20._8_4_;
      auVar16._12_4_ = auVar19._12_4_ + 0.0 + auVar20._12_4_;
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar4 = pRVar3->ptr_ofs;
      lVar14 = pRVar3->stride * i;
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14)),
                              ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x10)),0x1c);
      auVar15 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x20)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 4)),
                              ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x14)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x24)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 8)),
                              ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x28)),0x28);
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x1c)),0x1c);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x2c)),0x28);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar4 = pRVar3->ptr_ofs;
      lVar14 = pRVar3->stride * i;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(pcVar4 + lVar14 + 4);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x10);
      auVar15 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14)),_DAT_01fbb140,auVar31);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),_DAT_01fbb140,
                                      auVar35);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)),_DAT_01fbb140,
                                        auVar32);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x28);
      auVar16 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x24)),_DAT_01fbb140,auVar40)
      ;
    }
    else if (RVar1 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar4 = pRVar3->ptr_ofs;
      lVar14 = pRVar3->stride * i;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x10);
      auVar20 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(pcVar4 + lVar14 + 8)),0x20);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x34);
      auVar15 = vpermt2ps_avx512vl(auVar25,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar14)));
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(pcVar4 + lVar14 + 0x1c);
      fVar50 = *(float *)(pcVar4 + lVar14 + 0x24);
      fVar54 = *(float *)(pcVar4 + lVar14 + 0x28);
      fVar55 = *(float *)(pcVar4 + lVar14 + 0x2c);
      auVar19 = vpermt2ps_avx512vl(auVar41,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x18)))
      ;
      fVar56 = *(float *)(pcVar4 + lVar14 + 0x30);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar50),
                                ZEXT416((uint)fVar50));
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
      auVar18 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar16._0_4_));
      fVar43 = auVar18._0_4_;
      fVar43 = fVar43 * 1.5 + fVar43 * fVar43 * fVar43 * auVar16._0_4_ * -0.5;
      auVar16 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar43 * fVar50)),0x30);
      auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar43 * fVar54)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar20,ZEXT416((uint)(fVar43 * fVar56)),0x30);
      auVar20 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),
                              ZEXT416(*(uint *)(pcVar4 + lVar14 + 4)),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0x3c)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar20,ZEXT416((uint)(fVar55 * fVar43)),0x30);
    }
    else if (RVar1 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar4 = pRVar3->ptr_ofs;
      lVar14 = pRVar3->stride * i;
      auVar15 = *(undefined1 (*) [16])(pcVar4 + lVar14);
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar14 + 0x10))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar4 + lVar14 + 0x20))->v
      ;
      auVar16 = *(undefined1 (*) [16])(pcVar4 + lVar14 + 0x30);
    }
    auVar20 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar19 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar44._0_4_ = a0_1.field_0._0_4_ * auVar19._0_4_;
    auVar44._4_4_ = a0_1.field_0._4_4_ * auVar19._4_4_;
    auVar44._8_4_ = a0_1.field_0._8_4_ * auVar19._8_4_;
    auVar44._12_4_ = a0_1.field_0._12_4_ * auVar19._12_4_;
    auVar23 = vfmsub231ps_fma(auVar44,(undefined1  [16])a0.field_0,auVar20);
    auVar18 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar17 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar37._0_4_ = auVar15._0_4_ * auVar20._0_4_;
    auVar37._4_4_ = auVar15._4_4_ * auVar20._4_4_;
    auVar37._8_4_ = auVar15._8_4_ * auVar20._8_4_;
    auVar37._12_4_ = auVar15._12_4_ * auVar20._12_4_;
    auVar29 = vfmsub231ps_fma(auVar37,auVar17,(undefined1  [16])a0_1.field_0);
    auVar28._0_4_ = auVar17._0_4_ * a0.field_0._0_4_;
    auVar28._4_4_ = auVar17._4_4_ * a0.field_0._4_4_;
    auVar28._8_4_ = auVar17._8_4_ * a0.field_0._8_4_;
    auVar28._12_4_ = auVar17._12_4_ * a0.field_0._12_4_;
    auVar19 = vfmsub231ps_fma(auVar28,auVar15,auVar19);
    auVar20 = vshufps_avx(auVar19,auVar19,0xc9);
    auVar17 = vunpcklps_avx(auVar18,auVar20);
    auVar20 = vunpcklps_avx(auVar23,auVar19);
    auVar19 = vinsertps_avx(auVar29,auVar29,0x4a);
    auVar23 = vunpcklps_avx(auVar20,ZEXT416(auVar29._0_4_));
    auVar20 = vdpps_avx(auVar15,auVar18,0x7f);
    auVar15 = vunpcklps_avx(auVar17,auVar19);
    auVar19 = vunpckhps_avx(auVar17,auVar19);
    auVar26._0_4_ = auVar20._0_4_;
    auVar26._4_4_ = auVar26._0_4_;
    auVar26._8_4_ = auVar26._0_4_;
    auVar26._12_4_ = auVar26._0_4_;
    auVar15 = vdivps_avx(auVar15,auVar26);
    auVar19 = vdivps_avx(auVar19,auVar26);
    auVar18 = vdivps_avx(auVar23,auVar26);
    uVar30 = auVar16._0_4_;
    auVar27._4_4_ = uVar30;
    auVar27._0_4_ = uVar30;
    auVar27._8_4_ = uVar30;
    auVar27._12_4_ = uVar30;
    auVar20 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar33._0_4_ = auVar16._0_4_ * auVar18._0_4_;
    auVar33._4_4_ = auVar16._4_4_ * auVar18._4_4_;
    auVar33._8_4_ = auVar16._8_4_ * auVar18._8_4_;
    auVar33._12_4_ = auVar16._12_4_ * auVar18._12_4_;
    auVar16 = vfmadd231ps_fma(auVar33,auVar19,auVar20);
    auVar17 = vfmadd231ps_fma(auVar16,auVar15,auVar27);
    pAVar13 = InstanceArray::getObject(this,i);
    auVar16 = *(undefined1 (*) [16])(ray->org).field_0.m128;
    auVar20 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
    uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar6._4_4_ = uVar30;
    auVar6._0_4_ = uVar30;
    auVar6._8_4_ = uVar30;
    auVar6._12_4_ = uVar30;
    auVar17 = vfmsub231ps_avx512vl(auVar17,auVar18,auVar6);
    uVar30 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar7._4_4_ = uVar30;
    auVar7._0_4_ = uVar30;
    auVar7._8_4_ = uVar30;
    auVar7._12_4_ = uVar30;
    auVar17 = vfmadd231ps_avx512vl(auVar17,auVar19,auVar7);
    uVar30 = *(undefined4 *)&(ray->org).field_0;
    auVar8._4_4_ = uVar30;
    auVar8._0_4_ = uVar30;
    auVar8._8_4_ = uVar30;
    auVar8._12_4_ = uVar30;
    auVar17 = vfmadd231ps_avx512vl(auVar17,auVar15,auVar8);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar17,auVar16,8);
    (ray->org).field_0 = aVar5;
    uVar30 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar9._4_4_ = uVar30;
    auVar9._0_4_ = uVar30;
    auVar9._8_4_ = uVar30;
    auVar9._12_4_ = uVar30;
    auVar18 = vmulps_avx512vl(auVar18,auVar9);
    uVar30 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar10._4_4_ = uVar30;
    auVar10._0_4_ = uVar30;
    auVar10._8_4_ = uVar30;
    auVar10._12_4_ = uVar30;
    auVar19 = vfmadd231ps_avx512vl(auVar18,auVar19,auVar10);
    uVar30 = *(undefined4 *)&(ray->dir).field_0;
    auVar11._4_4_ = uVar30;
    auVar11._0_4_ = uVar30;
    auVar11._8_4_ = uVar30;
    auVar11._12_4_ = uVar30;
    auVar15 = vfmadd231ps_avx512vl(auVar19,auVar15,auVar11);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar15,auVar20,8);
    (ray->dir).field_0 = aVar5;
    (**(code **)&pAVar13->field_0x80)(&(pAVar13->super_AccelData).field_0x58,ray);
    local_58 = auVar16._0_8_;
    uStack_50 = auVar16._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_58;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_50;
    local_68 = auVar20._0_8_;
    uStack_60 = auVar20._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_68;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_60;
    bVar12 = ray->tfar < 0.0;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return bVar12;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }